

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O1

void __thiscall SchnorrSig_Constructor_Test::TestBody(SchnorrSig_Constructor_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  SchnorrSignature empty_obj;
  AssertHelper local_68;
  int local_5c;
  ByteData local_58;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  SchnorrSignature local_30;
  
  cfd::core::SchnorrSignature::SchnorrSignature(&local_30);
  local_5c = 0;
  cfd::core::SchnorrSignature::GetData(&local_58,&local_30,false);
  local_68.data_ = (AssertHelperData *)cfd::core::ByteData::GetDataSize(&local_58);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_40,"0","empty_obj.GetData().GetDataSize()",&local_5c,(unsigned_long *)&local_68);
  if ((long *)local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x58,message);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((long *)local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_58.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(SchnorrSig, Constructor) {
  SchnorrSignature empty_obj;
  EXPECT_EQ(0, empty_obj.GetData().GetDataSize());
}